

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

char * glslang::TIntermediate::getResourceName(TResourceType res)

{
  if (res < EResCount) {
    return &DAT_00769bc0 + *(int *)(&DAT_00769bc0 + (ulong)res * 4);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                ,0xed9,"static const char *glslang::TIntermediate::getResourceName(TResourceType)");
}

Assistant:

const char* TIntermediate::getResourceName(TResourceType res)
{
    switch (res) {
    case EResSampler: return "shift-sampler-binding";
    case EResTexture: return "shift-texture-binding";
    case EResImage:   return "shift-image-binding";
    case EResUbo:     return "shift-UBO-binding";
    case EResSsbo:    return "shift-ssbo-binding";
    case EResUav:     return "shift-uav-binding";
    default:
        assert(0); // internal error: should only be called with valid resource types.
        return nullptr;
    }
}